

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O3

void cf_h1_proxy_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  curl_socket_t sock;
  int add_flags;
  int remove_flags;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar1 = cf->ctx;
    sock = Curl_conn_cf_get_socket(cf,data);
    if ((pvVar1 == (void *)0x0) || (*(int *)((long)pvVar1 + 0x38) == 1)) {
      add_flags = 2;
      remove_flags = 1;
    }
    else {
      add_flags = 1;
      remove_flags = 2;
    }
    Curl_pollset_change(data,ps,sock,add_flags,remove_flags);
    return;
  }
  return;
}

Assistant:

static void cf_h1_proxy_adjust_pollset(struct Curl_cfilter *cf,
                                        struct Curl_easy *data,
                                        struct easy_pollset *ps)
{
  struct h1_tunnel_state *ts = cf->ctx;

  if(!cf->connected) {
    /* If we are not connected, but the filter "below" is
     * and not waiting on something, we are tunneling. */
    curl_socket_t sock = Curl_conn_cf_get_socket(cf, data);
    if(ts) {
      /* when we've sent a CONNECT to a proxy, we should rather either
         wait for the socket to become readable to be able to get the
         response headers or if we're still sending the request, wait
         for write. */
      if(ts->CONNECT.sending == HTTPSEND_REQUEST)
        Curl_pollset_set_out_only(data, ps, sock);
      else
        Curl_pollset_set_in_only(data, ps, sock);
    }
    else
      Curl_pollset_set_out_only(data, ps, sock);
  }
}